

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O2

void __thiscall
RuntimeObjectSystem::AddToRuntimeFileListImp
          (RuntimeObjectSystem *this,Path *filename,unsigned_short projectId_)

{
  ProjectSettings *pPVar1;
  __normal_iterator<FileSystemUtils::Path_*,_std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>_>
  _Var2;
  
  pPVar1 = GetProject(this,projectId_);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<FileSystemUtils::Path*,std::vector<FileSystemUtils::Path,std::allocator<FileSystemUtils::Path>>>,__gnu_cxx::__ops::_Iter_equals_val<FileSystemUtils::Path_const>>
                    ((pPVar1->m_RuntimeFileList).
                     super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (pPVar1->m_RuntimeFileList).
                     super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                     ._M_impl.super__Vector_impl_data._M_finish,filename);
  if (_Var2._M_current !=
      (pPVar1->m_RuntimeFileList).
      super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::push_back
            (&pPVar1->m_RuntimeFileList,filename);
  (**(code **)(*(long *)this->m_pFileChangeNotifier + 0x38))
            (this->m_pFileChangeNotifier,(filename->m_string)._M_dataplus._M_p,
             &this->super_IFileChangeListener);
  return;
}

Assistant:

void RuntimeObjectSystem::AddToRuntimeFileListImp( const FileSystemUtils::Path& filename, unsigned short projectId_ )
{
    ProjectSettings& project = GetProject( projectId_ );
    TFileList::iterator it = std::find( project.m_RuntimeFileList.begin( ), project.m_RuntimeFileList.end( ), filename );
    if( it == project.m_RuntimeFileList.end( ) )
	{
        project.m_RuntimeFileList.push_back( filename );
        m_pFileChangeNotifier->Watch( filename.c_str(), this );
	}
}